

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_grail_merge_right(int64_t *arr,int L1,int L2,int M)

{
  int64_t iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = L2 + L1;
  uVar5 = L1 - 1;
  lVar2 = (long)(iVar7 + M);
  iVar3 = M + L2 + L1;
  iVar6 = -iVar7;
  do {
    lVar4 = (long)(iVar7 + -1);
    while( true ) {
      iVar3 = iVar3 + -1;
      lVar2 = lVar2 + -1;
      if ((int)uVar5 < 0) {
        if (iVar6 + (int)lVar2 != -1) {
          lVar2 = (long)iVar3;
          for (; L1 <= lVar4; lVar4 = lVar4 + -1) {
            iVar1 = arr[lVar2];
            arr[lVar2] = arr[lVar4];
            lVar2 = lVar2 + -1;
            arr[lVar4] = iVar1;
          }
        }
        return;
      }
      if ((L1 < iVar7) && (arr[uVar5] <= arr[lVar4])) break;
      iVar1 = arr[lVar2];
      arr[lVar2] = arr[uVar5];
      arr[uVar5] = iVar1;
      uVar5 = uVar5 - 1;
    }
    iVar1 = arr[lVar2];
    arr[lVar2] = arr[lVar4];
    arr[lVar4] = iVar1;
    iVar6 = iVar6 + 1;
    iVar7 = iVar7 + -1;
  } while( true );
}

Assistant:

static void GRAIL_MERGE_RIGHT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = L1 + L2 + M - 1, p2 = L1 + L2 - 1, p1 = L1 - 1;

  while (p1 >= 0) {
    if (p2 < L1 || SORT_CMP_A(arr + p1, arr + p2) > 0) {
      GRAIL_SWAP1(arr + (p0--), arr + (p1--));
    } else {
      GRAIL_SWAP1(arr + (p0--), arr + (p2--));
    }
  }

  if (p2 != p0)
    while (p2 >= L1) {
      GRAIL_SWAP1(arr + (p0--), arr + (p2--));
    }
}